

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseNumber(State *state,int *number_out)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  
  pcVar2 = state->mangled_cur;
  if (*pcVar2 == 'n') {
    pcVar2 = pcVar2 + 1;
    state->mangled_cur = pcVar2;
    iVar1 = -1;
  }
  else {
    iVar1 = 1;
  }
  iVar4 = 0;
  for (lVar3 = 0; (byte)(pcVar2[lVar3] - 0x30U) < 10; lVar3 = lVar3 + 1) {
    iVar4 = iVar4 * 10 + (uint)(byte)pcVar2[lVar3] + -0x30;
  }
  if ((lVar3 != 0) && (state->mangled_cur = pcVar2 + lVar3, number_out != (int *)0x0)) {
    *number_out = iVar4 * iVar1;
  }
  return lVar3 != 0;
}

Assistant:

static bool ParseOneCharToken(State *state, const char one_char_token) {
  if (state->mangled_cur[0] == one_char_token) {
    ++state->mangled_cur;
    return true;
  }
  return false;
}